

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

string * __thiscall
chaiscript::AST_Node_Trace::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,AST_Node_Trace *this)

{
  pointer pAVar1;
  string *psVar2;
  ostream *poVar3;
  pointer this_00;
  ostringstream oss;
  char local_1d1;
  string *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(this->text)._M_dataplus._M_p,(this->text)._M_string_length);
  this_00 = (this->children).
            super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (this->children).
           super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1d0 = __return_storage_ptr__;
  if (this_00 != pAVar1) {
    do {
      pretty_print_abi_cxx11_(&local_1c8,this_00);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                         );
      local_1d1 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1d1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pAVar1);
  }
  psVar2 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string pretty_print() const {
      std::ostringstream oss;

      oss << text;

      for (const auto &elem : children) {
        oss << elem.pretty_print() << ' ';
      }

      return oss.str();
    }